

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_redrawallfortemplatecanvas(_glist *x,int action)

{
  t_pd x_00;
  int iVar1;
  t_symbol *ptVar2;
  t_object *ptVar3;
  t_atom *ptVar4;
  char *template;
  t_gobj **pptVar5;
  
  template = "struct";
  ptVar2 = gensym("struct");
  pptVar5 = &x->gl_list;
  while (x_00 = (t_pd)*pptVar5, x_00 != (t_pd)0x0) {
    template = (char *)x_00;
    ptVar3 = pd_checkobject((t_pd *)x_00);
    if ((ptVar3 != (t_object *)0x0) && ((ptVar3->field_0x2e & 3) == 1)) {
      template = (char *)ptVar3->te_binbuf;
      iVar1 = binbuf_getnatom((_binbuf *)template);
      if (1 < iVar1) {
        template = (char *)ptVar3->te_binbuf;
        ptVar4 = binbuf_getvec((_binbuf *)template);
        if (((ptVar4->a_type == A_SYMBOL) && (ptVar4[1].a_type == A_SYMBOL)) &&
           ((ptVar4->a_w).w_symbol == ptVar2)) {
          template = (char *)ptVar4[1].a_w.w_symbol;
          template_findbyname((t_symbol *)template);
          canvas_redrawallfortemplate((t_template *)template,action);
        }
      }
    }
    pptVar5 = (t_gobj **)&x_00->c_helpname;
  }
  canvas_redrawallfortemplate((t_template *)template,action);
  return;
}

Assistant:

void canvas_redrawallfortemplatecanvas(t_canvas *x, int action)
{
    t_gobj *g;
    t_template *tmpl;
    t_symbol *s1 = gensym("struct");
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_object *ob = pd_checkobject(&g->g_pd);
        t_atom *argv;
        if (!ob || ob->te_type != T_OBJECT ||
            binbuf_getnatom(ob->te_binbuf) < 2)
            continue;
        argv = binbuf_getvec(ob->te_binbuf);
        if (argv[0].a_type != A_SYMBOL || argv[1].a_type != A_SYMBOL
            || argv[0].a_w.w_symbol != s1)
                continue;
        tmpl = template_findbyname(argv[1].a_w.w_symbol);
        canvas_redrawallfortemplate(tmpl, action);
    }
    canvas_redrawallfortemplate(0, action);
}